

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var1;
  _Base_ptr p_Var2;
  _Base_ptr elem;
  code *cleanup;
  Arena *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar3;
  pair<int,_google::protobuf::internal::ExtensionSet::Extension> local_48;
  
  local_48.second.field_0.int64_value = 0;
  local_48.second.type = '\0';
  local_48.second.is_repeated = false;
  local_48.second._10_1_ = 0;
  local_48.second.is_packed = false;
  local_48.second.cached_size = 0;
  local_48.second.descriptor = (FieldDescriptor *)0x0;
  local_48.first = number;
  pVar3 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,&local_48);
  _Var1 = pVar3.first._M_node;
  _Var1._M_node[1]._M_right = (_Base_ptr)desc;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto switchD_00348a3c_default;
  *(undefined1 *)((long)&_Var1._M_node[1]._M_left + 1) = 1;
  *(FieldType *)&_Var1._M_node[1]._M_left = field_type;
  *(bool *)((long)&_Var1._M_node[1]._M_left + 3) = packed;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
  case 1:
  case 8:
    this_00 = this->arena_;
    if (this_00 != (Arena *)0x0) {
      elem = (_Base_ptr)
             Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      *(undefined8 *)elem = 0;
      elem->_M_parent = (_Base_ptr)0x0;
      p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
      elem->_M_parent = p_Var2;
      *(Arena **)p_Var2 = this_00;
      cleanup = arena_destruct_object<google::protobuf::RepeatedField<int>>;
      break;
    }
LAB_00348cb0:
    elem = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    goto LAB_00348cc3;
  case 2:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<long>::typeinfo,0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<long>>;
    break;
  case 3:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>;
    break;
  case 4:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10)
    ;
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>;
    break;
  case 5:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<double>::typeinfo,0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<double>>;
    break;
  case 6:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<float>::typeinfo,0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<float>>;
    break;
  case 7:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348cb0;
    elem = (_Base_ptr)
           Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
    *(undefined8 *)elem = 0;
    elem->_M_parent = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,8);
    elem->_M_parent = p_Var2;
    *(Arena **)p_Var2 = this_00;
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<bool>>;
    break;
  case 9:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
LAB_00348d11:
      elem = (_Base_ptr)operator_new(0x18);
      *(undefined8 *)elem = 0;
      elem->_M_parent = (_Base_ptr)0x0;
      elem->_M_left = (_Base_ptr)0x0;
      goto LAB_00348cc3;
    }
    elem = (_Base_ptr)
           Arena::AllocateAligned
                     (this_00,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
    *(Arena **)elem = this_00;
    elem->_M_parent = (_Base_ptr)0x0;
    elem->_M_left = (_Base_ptr)0x0;
    cleanup = arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>;
    break;
  case 10:
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00348d11;
    elem = (_Base_ptr)
           Arena::AllocateAligned
                     (this_00,(type_info *)
                              &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
    *(Arena **)elem = this_00;
    elem->_M_parent = (_Base_ptr)0x0;
    elem->_M_left = (_Base_ptr)0x0;
    cleanup = 
    arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>;
    break;
  default:
    goto switchD_00348a3c_default;
  }
  Arena::AddListNode(this_00,elem,cleanup);
LAB_00348cc3:
  _Var1._M_node[1]._M_parent = elem;
switchD_00348a3c_default:
  return _Var1._M_node[1]._M_parent;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_value =
            Arena::CreateMessage<RepeatedField<int32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_value =
            Arena::CreateMessage<RepeatedField<int64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_value =
            Arena::CreateMessage<RepeatedField<uint32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_value =
            Arena::CreateMessage<RepeatedField<uint64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField< ::std::string> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}